

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O0

error<idx2::err_code> __thiscall idx2::StrToMetaData(idx2 *this,stref FilePath,metadata *Meta)

{
  dtype dVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  stref sVar5;
  error<idx2::err_code> eVar6;
  cstr local_b0;
  err_code local_a8;
  undefined2 uStack_a4;
  anon_class_1_0_00000001 local_99;
  undefined1 local_98 [12];
  StringTo<idx2::dtype> local_81;
  cstr local_80;
  err_code local_78;
  undefined2 uStack_74;
  anon_class_1_0_00000001 local_69;
  char local_68 [8];
  char DType [8];
  stref FileName;
  metadata *Meta_local;
  stref FilePath_local;
  err_code local_20;
  undefined2 uStack_1c;
  undefined2 uStack_1a;
  
  lVar4 = FilePath._8_8_;
  FilePath_local.field_0._0_4_ = FilePath.field_0._0_4_;
  Meta_local = (metadata *)this;
  sVar5 = GetFileName((stref *)&Meta_local);
  DType = (char  [8])sVar5.field_0;
  iVar2 = __isoc99_sscanf(DType,"%[^-]-%[^-]-[%d-%d-%d]-%[^.]",lVar4,lVar4 + 0x40,lVar4 + 0x80,
                          lVar4 + 0x84,lVar4 + 0x88,local_68);
  if (iVar2 == 6) {
    iVar2 = tolower((int)local_68[0]);
    local_68[0] = (char)iVar2;
    local_98._0_8_ = local_68;
    sVar3 = strlen(local_68);
    local_98._8_4_ = (int)sVar3;
    sVar5._12_4_ = 0;
    local_98._0_8_ = SUB128(local_98,0);
    local_98._8_4_ = SUB124(local_98,8);
    sVar5.field_0 = (anon_union_8_2_2df48d06_for_stref_0)local_98._0_8_;
    sVar5.Size = local_98._8_4_;
    dVar1 = StringTo<idx2::dtype>::operator()(&local_81,sVar5);
    *(dtype *)(lVar4 + 0x8c) = dVar1;
    eVar6 = StrToMetaData::anon_class_1_0_00000001::operator()(&local_99);
    local_b0 = eVar6.Msg;
    FilePath_local._8_8_ = local_b0;
    local_a8 = eVar6.Code;
    local_20 = local_a8;
    uStack_a4 = eVar6._12_2_;
    uStack_1c = uStack_a4;
  }
  else {
    eVar6 = StrToMetaData::anon_class_1_0_00000001::operator()(&local_69);
    local_80 = eVar6.Msg;
    FilePath_local._8_8_ = local_80;
    local_78 = eVar6.Code;
    local_20 = local_78;
    uStack_74 = eVar6._12_2_;
    uStack_1c = uStack_74;
  }
  eVar6.Code = local_20;
  eVar6.Msg = (cstr)FilePath_local._8_8_;
  eVar6.StackIdx = (undefined1)uStack_1c;
  eVar6.StrGened = (bool)uStack_1c._1_1_;
  eVar6._14_2_ = uStack_1a;
  return eVar6;
}

Assistant:

error<>
StrToMetaData(stref FilePath, metadata* Meta)
{
  stref FileName = GetFileName(FilePath);
  char DType[8];
  idx2_ReturnErrorIf(6 != sscanf(FileName.ConstPtr,
                                 "%[^-]-%[^-]-[%d-%d-%d]-%[^.]",
                                 Meta->Name,
                                 Meta->Field,
                                 &Meta->Dims3.X,
                                 &Meta->Dims3.Y,
                                 &Meta->Dims3.Z,
                                 DType),
                     err_code::ParseFailed);

  DType[0] = (char)tolower(DType[0]);
  Meta->DType = StringTo<dtype>()(stref(DType));

  return idx2_Error(err_code::NoError);
}